

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap-reduce.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *this;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  bool help;
  allocator<char> local_451;
  allocator<char> local_450;
  allocator<char> local_44f;
  allocator<char> local_44e;
  allocator<char> local_44d;
  allocator<char> local_44c;
  allocator<char> local_44b;
  allocator<char> local_44a;
  allocator<char> local_449;
  allocator<char> local_448;
  allocator<char> local_447;
  allocator<char> local_446;
  allocator<char> local_445;
  allocator<char> local_444;
  allocator<char> local_443;
  allocator<char> local_442;
  bool verbose;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_440;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_438;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_430;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_428;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_420;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_418;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_410;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_408;
  environment env;
  communicator world;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  Options ops;
  Session session;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  Catch::Session::Session(&session);
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this = &ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"number",&local_442);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"number of points per block",&local_443);
  opts::Option<unsigned_long>
            ((opts *)&local_408,'n',&local_200,&SwapReduceFixture::num_points,&local_220);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_408);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"k",&local_444);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"use k-ary swap",&local_445);
  opts::Option<int>((opts *)&local_410,'k',&local_240,&SwapReduceFixture::k,&local_260);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_410);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"blocks",&local_446);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"number of blocks",&local_447);
  opts::Option<int>((opts *)&local_418,'b',&local_280,&SwapReduceFixture::nblocks,&local_2a0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_418);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"thread",&local_448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"number of threads",&local_449);
  opts::Option<int>((opts *)&local_420,'t',&local_2c0,&SwapReduceFixture::threads,&local_2e0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_420);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"memory",&local_44a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"number of blocks to keep in memory",&local_44b);
  opts::Option<int>((opts *)&local_428,'m',&local_300,&SwapReduceFixture::mem_blocks,&local_320);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_428);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"prefix",&local_44c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"prefix for external storage",&local_44d);
  opts::Option<std::__cxx11::string>
            ((opts *)&local_430,&local_340,&SwapReduceFixture::prefix_abi_cxx11_,&local_360);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_430);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"verbose",&local_44e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"print the block contents",&local_44f);
  opts::Option<bool>((opts *)&local_438,'v',&local_380,&verbose,&local_3a0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_438);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"help",&local_450);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"show help",&local_451);
  opts::Option<bool>((opts *)&local_440,'h',&local_3c0,&help,&local_3e0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_440);
  if (local_440._M_head_impl != (BasicOption *)0x0) {
    (*(local_440._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_440._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  if (local_438._M_head_impl != (BasicOption *)0x0) {
    (*(local_438._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_438._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  if (local_430._M_head_impl != (BasicOption *)0x0) {
    (*(local_430._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_430._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  if (local_428._M_head_impl != (BasicOption *)0x0) {
    (*(local_428._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_428._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  if (local_420._M_head_impl != (BasicOption *)0x0) {
    (*(local_420._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_420._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  if (local_418._M_head_impl != (BasicOption *)0x0) {
    (*(local_418._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_418._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  if (local_410._M_head_impl != (BasicOption *)0x0) {
    (*(local_410._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_410._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if (local_408._M_head_impl != (BasicOption *)0x0) {
    (*(local_408._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_408._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  bVar1 = opts::Options::parse(&ops,argc,argv);
  if ((bVar1) && (help != true)) {
    iVar2 = Catch::Session::run(&session);
  }
  else {
    iVar2 = 1;
    if (world.rank_ == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
      poVar3 = std::operator<<(poVar3,*argv);
      std::operator<<(poVar3," [OPTIONS]\n");
      std::operator<<((ostream *)&std::cout,
                      "Generates random particles in the domain and redistributes them into correct blocks.\n"
                     );
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  opts::Options::~Options(&ops);
  Catch::Session::~Session(&session);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv); // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator    world;           // equivalent of MPI_COMM_WORLD

    Catch::Session session;

    bool help, verbose;

    // get command line arguments
    using namespace opts;
    Options ops;
    ops
        >> Option('n', "number",  SwapReduceFixture::num_points,     "number of points per block")
        >> Option('k', "k",       SwapReduceFixture::k,              "use k-ary swap")
        >> Option('b', "blocks",  SwapReduceFixture::nblocks,        "number of blocks")
        >> Option('t', "thread",  SwapReduceFixture::threads,        "number of threads")
        >> Option('m', "memory",  SwapReduceFixture::mem_blocks,     "number of blocks to keep in memory")
        >> Option(     "prefix",  SwapReduceFixture::prefix,         "prefix for external storage")
        >> Option('v', "verbose", verbose,                           "print the block contents")
        >> Option('h', "help",    help,                              "show help")
        ;
    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << "Generates random particles in the domain and redistributes them into correct blocks.\n";
            std::cout << ops;
        }
        return 1;
    }

    return session.run();
}